

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc.c
# Opt level: O3

int Saig_ManBmcSimple(Aig_Man_t *pAig,int nFrames,int nSizeMax,int nConfLimit,int fRewrite,
                     int fVerbose,int *piFrame,int nCofFanLit,int fUseSatoko)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  Aig_Man_t *pAVar7;
  Cnf_Dat_t *pCnf;
  satoko_t *s;
  Vec_Ptr_t *pVVar8;
  Vec_Int_t *__ptr;
  int *piVar9;
  Abc_Cex_t *pAVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  int level;
  int iVar14;
  int Lit;
  timespec ts;
  Aig_Man_t *local_e0;
  sat_solver *local_d0;
  int local_c4;
  int local_c0;
  int local_bc;
  long local_b8;
  satoko_opts_t local_b0;
  ABC_INT64_T *local_40;
  long local_38;
  
  uVar13 = (ulong)(uint)nFrames;
  local_bc = nConfLimit;
  iVar4 = clock_gettime(3,(timespec *)&local_b0);
  if (iVar4 < 0) {
    lVar11 = 1;
  }
  else {
    lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_b0.prop_limit),8);
    lVar11 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_b0.conf_limit * -1000000;
  }
  if (nCofFanLit == 0) {
    if (nSizeMax < 1) {
      local_e0 = Saig_ManFramesBmc(pAig,nFrames);
    }
    else {
      local_e0 = Saig_ManFramesBmcLimit(pAig,nFrames,nSizeMax);
      uVar13 = (ulong)((uint)(0 < local_e0->nObjs[3] % pAig->nTruePos) +
                      local_e0->nObjs[3] / pAig->nTruePos);
    }
  }
  else {
    local_e0 = Gia_ManCofactorAig(pAig,nFrames,nCofFanLit);
    if (local_e0 == (Aig_Man_t *)0x0) {
      return -1;
    }
  }
  if (piFrame != (int *)0x0) {
    *piFrame = (int)uVar13;
  }
  if (fVerbose != 0) {
    uVar1 = pAig->nRegs;
    uVar2 = pAig->nTruePis;
    uVar6 = pAig->nTruePos;
    iVar4 = pAig->nObjs[6];
    iVar14 = pAig->nObjs[5];
    uVar5 = Aig_ManLevelNum(pAig);
    printf("Running \"bmc\". AIG:  PI/PO/Reg = %d/%d/%d.  Node = %6d. Lev = %5d.\n",(ulong)uVar2,
           (ulong)uVar6,(ulong)uVar1,(ulong)(uint)(iVar4 + iVar14),(ulong)uVar5);
    uVar1 = local_e0->nObjs[2];
    uVar2 = local_e0->nObjs[3];
    iVar4 = local_e0->nObjs[6];
    iVar14 = local_e0->nObjs[5];
    uVar6 = Aig_ManLevelNum(local_e0);
    level = 0x9f0bfb;
    printf("Time-frames (%d):  PI/PO = %d/%d.  Node = %6d. Lev = %5d.  ",uVar13,(ulong)uVar1,
           (ulong)uVar2,(ulong)(uint)(iVar4 + iVar14),(ulong)uVar6);
    Abc_Print(level,"%s =","Time");
    iVar14 = 3;
    iVar4 = clock_gettime(3,(timespec *)&local_b0);
    if (iVar4 < 0) {
      lVar12 = -1;
    }
    else {
      lVar12 = local_b0.prop_limit / 1000 + local_b0.conf_limit * 1000000;
    }
    Abc_Print(iVar14,"%9.2f sec\n",(double)(lVar12 + lVar11) / 1000000.0);
    fflush(_stdout);
  }
  if (fRewrite != 0) {
    clock_gettime(3,(timespec *)&local_b0);
    pAVar7 = Dar_ManRwsat(local_e0,1,0);
    Aig_ManStop(local_e0);
    local_e0 = pAVar7;
  }
  clock_gettime(3,(timespec *)&local_b0);
  pCnf = Cnf_Derive(local_e0,local_e0->nObjs[3]);
  lVar11 = (long)local_bc;
  local_38 = lVar11;
  if (fUseSatoko == 0) {
    local_d0 = sat_solver_new();
    sat_solver_setnvars(local_d0,pCnf->nVars);
    s = (satoko_t *)0x0;
    lVar11 = 0;
    while (lVar11 < pCnf->nClauses) {
      iVar4 = sat_solver_addclause(local_d0,pCnf->pClauses[lVar11],pCnf->pClauses[lVar11 + 1]);
      lVar11 = lVar11 + 1;
      if (iVar4 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmc.c"
                      ,0x11c,
                      "int Saig_ManBmcSimple(Aig_Man_t *, int, int, int, int, int, int *, int, int)"
                     );
      }
    }
  }
  else {
    satoko_default_opts(&local_b0);
    local_b0.conf_limit = lVar11;
    s = satoko_create();
    satoko_configure(s,&local_b0);
    satoko_setnvars(s,pCnf->nVars);
    lVar11 = 0;
    while (lVar11 < pCnf->nClauses) {
      piVar9 = pCnf->pClauses[lVar11];
      iVar4 = satoko_add_clause(s,piVar9,(int)((ulong)((long)pCnf->pClauses[lVar11 + 1] -
                                                      (long)piVar9) >> 2));
      lVar11 = lVar11 + 1;
      if (iVar4 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmc.c"
                      ,0x114,
                      "int Saig_ManBmcSimple(Aig_Man_t *, int, int, int, int, int, int *, int, int)"
                     );
      }
    }
    local_d0 = (sat_solver *)0x0;
  }
  if ((local_d0 == (sat_solver *)0x0) || (iVar4 = sat_solver_simplify(local_d0), iVar4 != 0)) {
    iVar4 = clock_gettime(3,(timespec *)&local_b0);
    if (iVar4 < 0) {
      local_b8 = -1;
    }
    else {
      local_b8 = local_b0.prop_limit / 1000 + local_b0.conf_limit * 1000000;
    }
    pVVar8 = local_e0->vCos;
    local_c4 = -1;
    if (0 < pVVar8->nSize) {
      local_40 = &(local_d0->stats).propagations;
      uVar13 = 0;
      do {
        pvVar3 = pVVar8->pArray[uVar13];
        local_c0 = pCnf->pVarNums[*(int *)((long)pvVar3 + 0x24)] * 2;
        clock_gettime(3,(timespec *)&local_b0);
        if (s == (satoko_t *)0x0) {
          iVar4 = sat_solver_solve(local_d0,&local_c0,&local_bc,local_38,0,0,0);
        }
        else {
          iVar4 = satoko_solve_assumptions_limit(s,&local_c0,1,local_bc);
        }
        if (iVar4 != -1) {
          if (iVar4 == 1) {
            __ptr = Cnf_DataCollectPiSatNums(pCnf,local_e0);
            if (s == (satoko_t *)0x0) {
              piVar9 = Sat_SolverGetModel(local_d0,__ptr->pArray,__ptr->nSize);
            }
            else {
              piVar9 = Sat2_SolverGetModel(s,__ptr->pArray,__ptr->nSize);
            }
            piVar9[local_e0->nObjs[2]] = *(int *)((long)pvVar3 + 0x24);
            pAVar10 = Fra_SmlCopyCounterExample(pAig,local_e0,piVar9);
            pAig->pSeqModel = pAVar10;
            free(piVar9);
            if (__ptr->pArray != (int *)0x0) {
              free(__ptr->pArray);
            }
            free(__ptr);
            local_c4 = 0;
          }
          else {
            local_c4 = -1;
          }
          if (piFrame != (int *)0x0) {
            *piFrame = (int)((long)((ulong)(uint)((int)uVar13 >> 0x1f) << 0x20 | uVar13 & 0xffffffff
                                   ) / (long)pAig->nTruePos);
          }
          break;
        }
        uVar13 = uVar13 + 1;
        pVVar8 = local_e0->vCos;
      } while ((long)uVar13 < (long)pVVar8->nSize);
    }
    if (local_d0 == (sat_solver *)0x0) goto LAB_00563b67;
  }
  else {
    local_c4 = -1;
  }
  sat_solver_delete(local_d0);
LAB_00563b67:
  if (s != (satoko_t *)0x0) {
    satoko_destroy(s);
  }
  Cnf_DataFree(pCnf);
  Aig_ManStop(local_e0);
  return local_c4;
}

Assistant:

int Saig_ManBmcSimple( Aig_Man_t * pAig, int nFrames, int nSizeMax, int nConfLimit, int fRewrite, int fVerbose, int * piFrame, int nCofFanLit, int fUseSatoko )
{
    extern Aig_Man_t * Gia_ManCofactorAig( Aig_Man_t * p, int nFrames, int nCofFanLit );
    sat_solver * pSat = NULL;
    satoko_t * pSat2 = NULL;
    Cnf_Dat_t * pCnf;
    Aig_Man_t * pFrames, * pAigTemp;
    Aig_Obj_t * pObj;
    int status, Lit, i, RetValue = -1;
    abctime clk;

    // derive the timeframes
    clk = Abc_Clock();
    if ( nCofFanLit )
    {
        pFrames = Gia_ManCofactorAig( pAig, nFrames, nCofFanLit );
        if ( pFrames == NULL )
            return -1;
    }
    else if ( nSizeMax > 0 )
    {
        pFrames = Saig_ManFramesBmcLimit( pAig, nFrames, nSizeMax );
        nFrames = Aig_ManCoNum(pFrames) / Saig_ManPoNum(pAig) + ((Aig_ManCoNum(pFrames) % Saig_ManPoNum(pAig)) > 0);
    }
    else
        pFrames = Saig_ManFramesBmc( pAig, nFrames );
    if ( piFrame )
        *piFrame = nFrames;
    if ( fVerbose )
    {
        printf( "Running \"bmc\". AIG:  PI/PO/Reg = %d/%d/%d.  Node = %6d. Lev = %5d.\n", 
            Saig_ManPiNum(pAig), Saig_ManPoNum(pAig), Saig_ManRegNum(pAig),
            Aig_ManNodeNum(pAig), Aig_ManLevelNum(pAig) );
        printf( "Time-frames (%d):  PI/PO = %d/%d.  Node = %6d. Lev = %5d.  ", 
            nFrames, Aig_ManCiNum(pFrames), Aig_ManCoNum(pFrames), 
            Aig_ManNodeNum(pFrames), Aig_ManLevelNum(pFrames) );
        ABC_PRT( "Time", Abc_Clock() - clk );
        fflush( stdout );
    }
    // rewrite the timeframes
    if ( fRewrite )
    {
        clk = Abc_Clock();
//        pFrames = Dar_ManBalance( pAigTemp = pFrames, 0 );
        pFrames = Dar_ManRwsat( pAigTemp = pFrames, 1, 0 );
        Aig_ManStop( pAigTemp );
        if ( fVerbose )
        {
            printf( "Time-frames after rewriting:  Node = %6d. Lev = %5d.  ", 
                Aig_ManNodeNum(pFrames), Aig_ManLevelNum(pFrames) );
            ABC_PRT( "Time", Abc_Clock() - clk );
            fflush( stdout );
        }
    }
    // create the SAT solver
    clk = Abc_Clock();
    pCnf = Cnf_Derive( pFrames, Aig_ManCoNum(pFrames) );  
//if ( s_fInterrupt )
//return -1;
    if ( fUseSatoko )
    {
        satoko_opts_t opts;
        satoko_default_opts(&opts);
        opts.conf_limit = nConfLimit;
        pSat2 = satoko_create();  
        satoko_configure(pSat2, &opts);
        satoko_setnvars(pSat2, pCnf->nVars);
        for ( i = 0; i < pCnf->nClauses; i++ )
            if ( !satoko_add_clause( pSat2, pCnf->pClauses[i], pCnf->pClauses[i+1]-pCnf->pClauses[i] ) )
                assert( 0 );
    }
    else
    {
        pSat = sat_solver_new();
        sat_solver_setnvars( pSat, pCnf->nVars );
        for ( i = 0; i < pCnf->nClauses; i++ )
            if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
                assert( 0 );
    }
    if ( fVerbose )
    {
        printf( "CNF: Variables = %6d. Clauses = %7d. Literals = %8d. ", pCnf->nVars, pCnf->nClauses, pCnf->nLiterals );
        ABC_PRT( "Time", Abc_Clock() - clk );
        fflush( stdout );
    }
    status = pSat ? sat_solver_simplify(pSat) : 1;
    if ( status == 0 )
    {
        if ( fVerbose )
        {
            printf( "The BMC problem is trivially UNSAT\n" );
            fflush( stdout );
        }
    }
    else
    {
        abctime clkPart = Abc_Clock();
        Aig_ManForEachCo( pFrames, pObj, i )
        {
            Lit = toLitCond( pCnf->pVarNums[pObj->Id], 0 );
            if ( fVerbose )
            {
                printf( "Solving output %2d of frame %3d ... \r", 
                    i % Saig_ManPoNum(pAig), i / Saig_ManPoNum(pAig) );
            }
            clk = Abc_Clock();
            if ( pSat2 )
                status = satoko_solve_assumptions_limit( pSat2, &Lit, 1, nConfLimit );
            else
                status = sat_solver_solve( pSat, &Lit, &Lit + 1, (ABC_INT64_T)nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
            if ( fVerbose && (i % Saig_ManPoNum(pAig) == Saig_ManPoNum(pAig) - 1) )
            {
                printf( "Solved %2d outputs of frame %3d.  ", 
                    Saig_ManPoNum(pAig), i / Saig_ManPoNum(pAig) );
                printf( "Conf =%8.0f. Imp =%11.0f. ", 
                    (double)(pSat ? pSat->stats.conflicts    : satoko_conflictnum(pSat2)), 
                    (double)(pSat ? pSat->stats.propagations : satoko_stats(pSat2)->n_propagations) );
                ABC_PRT( "T", Abc_Clock() - clkPart );
                clkPart = Abc_Clock();
                fflush( stdout );
            }
            if ( status == l_False )
            {
/*
                Lit = lit_neg( Lit );
                RetValue = sat_solver_addclause( pSat, &Lit, &Lit + 1 );
                assert( RetValue );
                if ( pSat->qtail != pSat->qhead )
                {
                    RetValue = sat_solver_simplify(pSat);
                    assert( RetValue );
                }
*/
            }
            else if ( status == l_True )
            {
                Vec_Int_t * vCiIds = Cnf_DataCollectPiSatNums( pCnf, pFrames );
                int * pModel = pSat2 ? Sat2_SolverGetModel(pSat2, vCiIds->pArray, vCiIds->nSize) : Sat_SolverGetModel(pSat, vCiIds->pArray, vCiIds->nSize);
                pModel[Aig_ManCiNum(pFrames)] = pObj->Id;
                pAig->pSeqModel = Fra_SmlCopyCounterExample( pAig, pFrames, pModel );
                ABC_FREE( pModel );
                Vec_IntFree( vCiIds );

                if ( piFrame )
                    *piFrame = i / Saig_ManPoNum(pAig);
                RetValue = 0;
                break;
            }
            else
            {
                if ( piFrame )
                    *piFrame = i / Saig_ManPoNum(pAig);
                RetValue = -1;
                break;
            }
        }
    }
    if ( pSat )  sat_solver_delete( pSat );
    if ( pSat2 ) satoko_destroy( pSat2 );
    Cnf_DataFree( pCnf );
    Aig_ManStop( pFrames );
    return RetValue;
}